

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_structural_infix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_CMP,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_structural_infix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a2 G->val[-1]
#define a1 G->val[-2]
  yyprintf((stderr, "do yy_2_structural_infix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=PVIP_node_new_children2(&(G->data), PVIP_NODE_CMP, a1, a2); a1=yy; }\n"));
  yy=PVIP_node_new_children2(&(G->data), PVIP_NODE_CMP, a1, a2); a1=yy; ;
#undef a2
#undef a1
}